

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::saveRawFile
          (CommandExtract *this,string *filepath,bool appendExtension,char *data,size_t size)

{
  bool bVar1;
  int in_ECX;
  byte in_DL;
  string *in_RSI;
  long in_RDI;
  void *in_R8;
  Reporter *in_stack_00000010;
  string *in_stack_00000018;
  OutputStream *in_stack_00000020;
  OutputStream file;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  OutputStream *this_00;
  OutputStream local_50;
  void *local_28;
  int local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_28 = in_R8;
  local_20 = in_ECX;
  if ((local_11 != 0) &&
     (bVar1 = std::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1)) {
    std::__cxx11::string::operator+=(in_RSI,".raw");
  }
  this_00 = &local_50;
  OutputStream::OutputStream(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  OutputStream::write(this_00,local_20,local_28,in_RDI + 8);
  OutputStream::~OutputStream(this_00);
  return;
}

Assistant:

void CommandExtract::saveRawFile(std::string filepath, bool appendExtension, const char* data, std::size_t size) {
    if (appendExtension && filepath != "-")
        filepath += ".raw";
    OutputStream file(filepath, *this);
    file.write(data, size, *this);
}